

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RDLtesting.c
# Opt level: O0

uint RDL_count_bonds(char *bitset,uint nofBonds)

{
  uint local_1c;
  uint local_18;
  uint idx;
  uint count;
  uint nofBonds_local;
  char *bitset_local;
  
  local_18 = 0;
  for (local_1c = 0; local_1c < nofBonds; local_1c = local_1c + 1) {
    if (bitset[local_1c] != '\0') {
      local_18 = local_18 + 1;
    }
  }
  return local_18;
}

Assistant:

unsigned RDL_count_bonds(const char* bitset, unsigned nofBonds)
{
  unsigned count;
  unsigned idx;

  for (idx = 0, count = 0; idx < nofBonds; ++idx) {
    if (bitset[idx]) {
      ++count;
    }
  }

  return count;
}